

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall
pbrt::ParsedScene::CreateMaterials
          (ParsedScene *this,NamedTextures *textures,Allocator alloc,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
          *namedMaterialsOut,
          vector<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_> *materialsOut)

{
  ParameterDictionary *this_00;
  pointer ppVar1;
  pointer pSVar2;
  iterator __position;
  _Rep_type *p_Var3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
  *this_01;
  pointer pbVar4;
  pointer pbVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  mapped_type *ppIVar8;
  mapped_type pIVar9;
  char *__end;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
  *nm;
  pointer ppVar10;
  pointer pSVar11;
  string type;
  string fn_2;
  TextureParameterDictionary texDict;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>_>_>
  normalMapCache;
  mutex mutex;
  MaterialHandle m;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  normalMapFilenameVector;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  normalMapFilenames;
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  ParsedScene *local_188;
  string local_180;
  string local_160;
  undefined1 local_140 [32];
  _Base_ptr local_120;
  size_t local_118;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
  *local_110;
  string local_108;
  undefined8 local_e8;
  Allocator local_e0;
  vector<pbrt::MaterialHandle,std::allocator<pbrt::MaterialHandle>> *local_d8;
  NamedTextures *local_d0;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  code *local_88;
  undefined8 uStack_80;
  code *pcStack_78;
  code *pcStack_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppVar10 = (this->namedMaterials).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->namedMaterials).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_188 = this;
  local_110 = &namedMaterialsOut->_M_t;
  local_e0.memoryResource = alloc.memoryResource;
  local_d8 = (vector<pbrt::MaterialHandle,std::allocator<pbrt::MaterialHandle>> *)materialsOut;
  local_d0 = textures;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppVar10 != ppVar1) {
    do {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"normalmap","");
      local_1a8._M_unused._M_object = &local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"","");
      ParameterDictionary::GetOneString
                ((string *)local_140,&(ppVar10->second).parameters,&local_108,(string *)&local_1a8);
      if ((code **)local_1a8._M_unused._0_8_ != &local_198) {
        operator_delete(local_1a8._M_unused._M_object,(ulong)(local_198 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if (local_140._8_8_ != 0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
      }
      if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
        operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
      }
      ppVar10 = ppVar10 + 1;
    } while (ppVar10 != ppVar1);
  }
  pSVar11 = (local_188->materials).
            super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar2 = (local_188->materials).
           super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar11 != pSVar2) {
    do {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"normalmap","");
      local_1a8._M_unused._M_object = &local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"","");
      ParameterDictionary::GetOneString
                ((string *)local_140,&pSVar11->parameters,&local_108,(string *)&local_1a8);
      if ((code **)local_1a8._M_unused._0_8_ != &local_198) {
        operator_delete(local_1a8._M_unused._M_object,(ulong)(local_198 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if (local_140._8_8_ != 0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
      }
      if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
        operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
      }
      pSVar11 = pSVar11 + 1;
    } while (pSVar11 != pSVar2);
  }
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__copy_move<false,false,std::bidirectional_iterator_tag>::
  __copy_m<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_60._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&local_60._M_impl.super__Rb_tree_header,&local_a8);
  if (LOGGING_LogLevel < 1) {
    local_140._8_8_ = 0;
    local_140._16_8_ = local_140._16_8_ & 0xffffffffffffff00;
    local_108._M_dataplus._M_p =
         (pointer)((long)local_a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
    local_140._0_8_ = local_140 + 0x10;
    detail::stringPrintfRecursive<unsigned_long>
              ((string *)local_140,"Reading %d normal maps in parallel",(unsigned_long *)&local_108)
    ;
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
        ,0x2ae,(char *)local_140._0_8_);
    if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
  }
  pbVar5 = local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_140._24_8_ = local_140 + 8;
  local_e8 = 0;
  local_140._8_8_ = local_140._8_8_ & 0xffffffff00000000;
  local_140._16_8_ = 0;
  local_118 = 0;
  local_108._M_dataplus._M_p = (pointer)0x0;
  local_108._M_string_length = 0;
  local_108.field_2._M_allocated_capacity = 0;
  local_108.field_2._8_8_ = 0;
  local_88 = (code *)0x0;
  uStack_80 = 0;
  pcStack_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_120 = (_Base_ptr)local_140._24_8_;
  local_88 = (code *)operator_new(0x28);
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)local_88 = &local_a8;
  local_1a8._M_unused._M_object = &local_88;
  *(ParsedScene **)(local_88 + 8) = local_188;
  *(Allocator **)(local_88 + 0x10) = &local_e0;
  *(string **)(local_88 + 0x18) = &local_108;
  *(undefined1 **)(local_88 + 0x20) = local_140;
  pcStack_70 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp:689:52)>
               ::_M_invoke;
  pcStack_78 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp:689:52)>
               ::_M_manager;
  local_1a8._8_8_ = 0;
  local_190 = std::
              _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
              ::_M_invoke;
  local_198 = std::
              _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
              ::_M_manager;
  ParallelFor(0,(long)pbVar5 - (long)pbVar4 >> 5,(function<void_(long,_long)> *)&local_1a8);
  if (local_198 != (code *)0x0) {
    (*local_198)(&local_1a8,&local_1a8,3);
  }
  if (pcStack_78 != (code *)0x0) {
    (*pcStack_78)(&local_88,&local_88,3);
  }
  if (LOGGING_LogLevel < 1) {
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
        ,0x2c1,"Done reading normal maps");
  }
  ppVar10 = (local_188->namedMaterials).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (local_188->namedMaterials).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar10 != ppVar1) {
    p_Var3 = (_Rep_type *)&local_110->_M_impl;
    do {
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
              ::find(local_110,&ppVar10->first);
      if ((_Rb_tree_header *)iVar6._M_node == &(p_Var3->_M_impl).super__Rb_tree_header) {
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"type","");
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
        this_00 = &(ppVar10->second).parameters;
        ParameterDictionary::GetOneString((string *)&local_1a8,this_00,&local_180,&local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if (local_1a8._8_8_ == 0) {
          SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                    (&local_188->super_SceneRepresentation,&(ppVar10->second).loc,
                     "%s: \"string type\" not provided in named material\'s parameters.",
                     &ppVar10->first);
        }
        else {
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"normalmap","");
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
          ParameterDictionary::GetOneString(&local_180,this_00,&local_160,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if (local_180._M_string_length == 0) {
            pIVar9 = (Image *)0x0;
          }
          else {
            ppIVar8 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>_>_>
                                    *)local_140,&local_180);
            pIVar9 = *ppIVar8;
          }
          TextureParameterDictionary::TextureParameterDictionary
                    ((TextureParameterDictionary *)&local_160,this_00,local_d0);
          this_01 = local_110;
          MaterialHandle::Create
                    ((MaterialHandle *)&local_c8,(string *)&local_1a8,
                     (TextureParameterDictionary *)&local_160,pIVar9,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                      *)local_110,&(ppVar10->second).loc,local_e0);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                                 *)this_01,&ppVar10->first);
          (pmVar7->
          super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          ).bits = (uintptr_t)local_c8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
        }
        if ((code **)local_1a8._M_unused._0_8_ != &local_198) {
          operator_delete(local_1a8._M_unused._M_object,(ulong)(local_198 + 1));
        }
      }
      else {
        SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                  (&local_188->super_SceneRepresentation,&(ppVar10->second).loc,
                   "%s: trying to redefine named material.",&ppVar10->first);
      }
      ppVar10 = ppVar10 + 1;
    } while (ppVar10 != ppVar1);
  }
  std::vector<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>::reserve
            ((vector<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_> *)local_d8,
             ((long)(local_188->materials).
                    super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(local_188->materials).
                    super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 5) * -0x3333333333333333);
  pSVar11 = (local_188->materials).
            super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar2 = (local_188->materials).
           super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar11 != pSVar2) {
    do {
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"normalmap","");
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
      ParameterDictionary::GetOneString
                ((string *)&local_1a8,&pSVar11->parameters,&local_180,&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      if (local_1a8._8_8_ == 0) {
        pIVar9 = (Image *)0x0;
      }
      else {
        ppIVar8 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>_>_>
                                *)local_140,(key_type *)&local_1a8);
        pIVar9 = *ppIVar8;
      }
      TextureParameterDictionary::TextureParameterDictionary
                ((TextureParameterDictionary *)&local_180,&pSVar11->parameters,local_d0);
      MaterialHandle::Create
                ((MaterialHandle *)&local_160,&pSVar11->name,
                 (TextureParameterDictionary *)&local_180,pIVar9,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                  *)local_110,&pSVar11->loc,local_e0);
      __position._M_current = *(MaterialHandle **)(local_d8 + 8);
      if (__position._M_current == *(MaterialHandle **)(local_d8 + 0x10)) {
        std::vector<pbrt::MaterialHandle,std::allocator<pbrt::MaterialHandle>>::
        _M_realloc_insert<pbrt::MaterialHandle_const&>
                  (local_d8,__position,(MaterialHandle *)&local_160);
      }
      else {
        ((__position._M_current)->
        super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
        ).bits = 0;
        ((__position._M_current)->
        super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
        ).bits = (uintptr_t)local_160._M_dataplus._M_p;
        *(MaterialHandle **)(local_d8 + 8) = __position._M_current + 1;
      }
      if ((code **)local_1a8._M_unused._0_8_ != &local_198) {
        operator_delete(local_1a8._M_unused._M_object,(ulong)(local_198 + 1));
      }
      pSVar11 = pSVar11 + 1;
    } while (pSVar11 != pSVar2);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>_>_>
               *)local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void ParsedScene::CreateMaterials(
    /*const*/ NamedTextures &textures, Allocator alloc,
    std::map<std::string, MaterialHandle> *namedMaterialsOut,
    std::vector<MaterialHandle> *materialsOut) const {
    // First, load all of the normal maps in parallel.
    std::set<std::string> normalMapFilenames;
    for (const auto &nm : namedMaterials) {
        std::string fn = nm.second.parameters.GetOneString("normalmap", "");
        if (!fn.empty())
            normalMapFilenames.insert(fn);
    }
    for (const auto &mtl : materials) {
        std::string fn = mtl.parameters.GetOneString("normalmap", "");
        if (!fn.empty())
            normalMapFilenames.insert(fn);
    }

    std::vector<std::string> normalMapFilenameVector;
    std::copy(normalMapFilenames.begin(), normalMapFilenames.end(),
              std::back_inserter(normalMapFilenameVector));

    LOG_VERBOSE("Reading %d normal maps in parallel", normalMapFilenameVector.size());
    std::map<std::string, Image *> normalMapCache;
    std::mutex mutex;
    ParallelFor(0, normalMapFilenameVector.size(), [&](int64_t index) {
        std::string filename = normalMapFilenameVector[index];
        ImageAndMetadata immeta =
            Image::Read(filename, Allocator(), ColorEncodingHandle::Linear);
        Image &image = immeta.image;
        ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
        if (!rgbDesc)
            ErrorExitDeferred("%s: normal map image must contain R, G, and B channels",
                              filename);
        Image *normalMap = alloc.new_object<Image>(alloc);
        *normalMap = image.SelectChannels(rgbDesc);

        mutex.lock();
        normalMapCache[filename] = normalMap;
        mutex.unlock();
    });
    LOG_VERBOSE("Done reading normal maps");

    // Named materials
    for (const auto &nm : namedMaterials) {
        const std::string &name = nm.first;
        const SceneEntity &mtl = nm.second;
        if (namedMaterialsOut->find(name) != namedMaterialsOut->end()) {
            ErrorExitDeferred(&mtl.loc, "%s: trying to redefine named material.", name);
            continue;
        }

        std::string type = mtl.parameters.GetOneString("type", "");
        if (type.empty()) {
            ErrorExitDeferred(&mtl.loc,
                              "%s: \"string type\" not provided in named material's "
                              "parameters.",
                              name);
            continue;
        }

        std::string fn = nm.second.parameters.GetOneString("normalmap", "");
        Image *normalMap = !fn.empty() ? normalMapCache[fn] : nullptr;

        TextureParameterDictionary texDict(&mtl.parameters, &textures);
        MaterialHandle m = MaterialHandle::Create(type, texDict, normalMap,
                                                  *namedMaterialsOut, &mtl.loc, alloc);
        (*namedMaterialsOut)[name] = m;
    }

    // Regular materials
    materialsOut->reserve(materials.size());
    for (const auto &mtl : materials) {
        std::string fn = mtl.parameters.GetOneString("normalmap", "");
        Image *normalMap = !fn.empty() ? normalMapCache[fn] : nullptr;

        TextureParameterDictionary texDict(&mtl.parameters, &textures);
        MaterialHandle m = MaterialHandle::Create(mtl.name, texDict, normalMap,
                                                  *namedMaterialsOut, &mtl.loc, alloc);
        materialsOut->push_back(m);
    }
}